

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderLocals.cpp
# Opt level: O0

void __thiscall wasm::ReorderLocals::ReorderLocals(ReorderLocals *this)

{
  ReorderLocals *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__ReorderLocals_0271a8a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->counts);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->firstUses);
  this->firstUseIndex = 1;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }